

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O2

CExtPubKey * __thiscall CExtKey::Neuter(CExtPubKey *__return_storage_ptr__,CExtKey *this)

{
  ChainCode *pCVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  base_blob<256U> *pbVar6;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar6 = &(__return_storage_ptr__->chaincode).super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0x10] = '\0';
  (pbVar6->m_data)._M_elems[0x11] = '\0';
  (pbVar6->m_data)._M_elems[0x12] = '\0';
  (pbVar6->m_data)._M_elems[0x13] = '\0';
  (pbVar6->m_data)._M_elems[0x14] = '\0';
  (pbVar6->m_data)._M_elems[0x15] = '\0';
  (pbVar6->m_data)._M_elems[0x16] = '\0';
  (pbVar6->m_data)._M_elems[0x17] = '\0';
  pbVar6 = &(__return_storage_ptr__->chaincode).super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[0x18] = '\0';
  (pbVar6->m_data)._M_elems[0x19] = '\0';
  (pbVar6->m_data)._M_elems[0x1a] = '\0';
  (pbVar6->m_data)._M_elems[0x1b] = '\0';
  (pbVar6->m_data)._M_elems[0x1c] = '\0';
  (pbVar6->m_data)._M_elems[0x1d] = '\0';
  (pbVar6->m_data)._M_elems[0x1e] = '\0';
  (pbVar6->m_data)._M_elems[0x1f] = '\0';
  pCVar1 = &__return_storage_ptr__->chaincode;
  (pCVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (pCVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (pCVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (pCVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (pCVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (pCVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (pCVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (pCVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar6 = &(__return_storage_ptr__->chaincode).super_base_blob<256U>;
  (pbVar6->m_data)._M_elems[8] = '\0';
  (pbVar6->m_data)._M_elems[9] = '\0';
  (pbVar6->m_data)._M_elems[10] = '\0';
  (pbVar6->m_data)._M_elems[0xb] = '\0';
  (pbVar6->m_data)._M_elems[0xc] = '\0';
  (pbVar6->m_data)._M_elems[0xd] = '\0';
  (pbVar6->m_data)._M_elems[0xe] = '\0';
  (pbVar6->m_data)._M_elems[0xf] = '\0';
  (__return_storage_ptr__->pubkey).vch[0] = 0xff;
  __return_storage_ptr__->nDepth = this->nDepth;
  *(undefined4 *)__return_storage_ptr__->vchFingerprint = *(undefined4 *)this->vchFingerprint;
  __return_storage_ptr__->nChild = this->nChild;
  CKey::GetPubKey(&__return_storage_ptr__->pubkey,&this->key);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    uVar3 = *(undefined8 *)(this->chaincode).super_base_blob<256U>.m_data._M_elems;
    uVar4 = *(undefined8 *)((this->chaincode).super_base_blob<256U>.m_data._M_elems + 8);
    uVar5 = *(undefined8 *)((this->chaincode).super_base_blob<256U>.m_data._M_elems + 0x18);
    *(undefined8 *)
     ((__return_storage_ptr__->chaincode).super_base_blob<256U>.m_data._M_elems + 0x10) =
         *(undefined8 *)((this->chaincode).super_base_blob<256U>.m_data._M_elems + 0x10);
    *(undefined8 *)
     ((__return_storage_ptr__->chaincode).super_base_blob<256U>.m_data._M_elems + 0x18) = uVar5;
    *(undefined8 *)(__return_storage_ptr__->chaincode).super_base_blob<256U>.m_data._M_elems = uVar3
    ;
    *(undefined8 *)((__return_storage_ptr__->chaincode).super_base_blob<256U>.m_data._M_elems + 8) =
         uVar4;
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

CExtPubKey CExtKey::Neuter() const {
    CExtPubKey ret;
    ret.nDepth = nDepth;
    memcpy(ret.vchFingerprint, vchFingerprint, 4);
    ret.nChild = nChild;
    ret.pubkey = key.GetPubKey();
    ret.chaincode = chaincode;
    return ret;
}